

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtualpage.cpp
# Opt level: O3

void __thiscall sai::VirtualPage::DecryptTable(VirtualPage *this,uint32_t PageIndex)

{
  uint uVar1;
  long lVar2;
  uint uVar3;
  
  lVar2 = 0;
  uVar3 = PageIndex & 0xfffffe00;
  do {
    uVar1 = *(uint *)(this + lVar2);
    uVar3 = uVar3 ^ uVar1 ^
            *(int *)(Keys::User + (uVar3 >> 0xe & 0x3fc)) +
            *(int *)(Keys::User + (ulong)(uVar3 >> 0x18) * 4) +
            *(int *)(Keys::User + (ulong)(uVar3 >> 8 & 0xff) * 4) +
            *(int *)(Keys::User + (ulong)(uVar3 & 0xff) * 4);
    *(uint *)(this + lVar2) = uVar3 << 0x10 | uVar3 >> 0x10;
    lVar2 = lVar2 + 4;
    uVar3 = uVar1;
  } while (lVar2 != 0x1000);
  return;
}

Assistant:

void VirtualPage::DecryptTable(std::uint32_t PageIndex)
{
	std::uint32_t PrevData = PageIndex & (~0x1FF);
#if defined(__AVX2__)
	__m256i PrevData8 = _mm256_set1_epi32(PrevData);
	for( std::size_t i = 0; i < (PageSize / sizeof(std::uint32_t)); i += 8 )
	{
		const __m256i CurData8 = _mm256_loadu_si256((__m256i*)(u32 + i));
		// There is no true _mm_alignr_epi8 for AVX2
		// An extra _mm256_permute2x128_si256 is needed
		PrevData8 = _mm256_alignr_epi8(
			CurData8, _mm256_permute2x128_si256(PrevData8, CurData8, _MM_SHUFFLE(0, 2, 0, 1)),
			sizeof(std::uint32_t) * 3
		);
		__m256i CurPlain8 = _mm256_xor_si256(
			_mm256_xor_si256(CurData8, PrevData8), KeySum8(PrevData8, Keys::User)
		);
		CurPlain8 = _mm256_shuffle_epi8(
			CurPlain8, _mm256_set_epi8(
						   13, 12, 15, 14, 9, 8, 11, 10, 5, 4, 7, 6, 1, 0, 3, 2, 13, 12, 15, 14, 9,
						   8, 11, 10, 5, 4, 7, 6, 1, 0, 3, 2
					   )
		);
		_mm256_storeu_si256((__m256i*)(u32 + i), CurPlain8);
		PrevData8 = CurData8;
	};
#else
	for( std::uint32_t& CurData : u32 )
	{
		std::uint32_t X = PrevData ^ CurData;
		X ^= Keys::User[(PrevData >> 24) & 0xFF] + Keys::User[(PrevData >> 16) & 0xFF]
		   + Keys::User[(PrevData >> 8) & 0xFF] + Keys::User[(PrevData >> 0) & 0xFF];
		PrevData = CurData;
		// CurData  = static_cast<std::uint32_t>((X << 16) | (X >> 16));
		CurData = std::rotl(X, 16);
	};
#endif
}